

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)>::
UntypedPerformAction
          (FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<double> *pAVar1;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> *in_RDX;
  ArgumentTuple *args;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> action;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> local_28;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> *local_18;
  
  local_18 = in_RDX;
  Action<double_(const_char_*,_char_**,___locale_struct_*)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<double>::PerformAction<double(char_const*,char**,__locale_struct*)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<double_(const_char_*,_char_**,___locale_struct_*)>::~Action
            ((Action<double_(const_char_*,_char_**,___locale_struct_*)> *)0x13e931);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }